

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O3

void Eigen::internal::general_matrix_matrix_product<long,_float,_1,_false,_float,_0,_false,_0,_1>::
     run(long rows,long cols,long depth,float *_lhs,long lhsStride,float *_rhs,long rhsStride,
        ResScalar *_res,long resIncr,long resStride,ResScalar alpha,
        level3_blocking<float,_float> *blocking,GemmParallelInfo<long> *info)

{
  long lVar1;
  ResScalar alpha_00;
  RhsScalar *pRVar2;
  LhsScalar *pLVar3;
  undefined8 *puVar4;
  ulong uVar5;
  LhsScalar *pLVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  long local_128;
  long local_120;
  long local_118;
  float *local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  float *local_e8;
  float *local_e0;
  long local_d8;
  long local_d0;
  float *local_c8;
  long local_c0;
  ulong local_b8;
  ResScalar local_ac;
  float *local_a8;
  long local_a0;
  float *local_98;
  long local_90;
  blas_data_mapper<float,_long,_0,_0,_1> local_88;
  RhsScalar *local_78;
  LhsScalar *local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  LhsScalar *local_48;
  RhsScalar *local_40;
  gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_1,_false,_false>
  local_35;
  gemm_pack_rhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_4,_0,_false,_false>
  local_34;
  gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
  local_33;
  byte local_32;
  bool local_31;
  gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_1,_false,_false>
  pack_lhs;
  gemm_pack_rhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_4,_0,_false,_false>
  pack_rhs;
  gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
  gebp;
  
  pLVar6 = (LhsScalar *)&local_128;
  local_ac = alpha;
  local_e8 = _rhs;
  local_d0 = lhsStride;
  local_e0 = _lhs;
  if (resIncr != 1) {
    __assert_fail("incr==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/BlasUtil.h"
                  ,0xae,
                  "Eigen::internal::blas_data_mapper<float, long, 0>::blas_data_mapper(Scalar *, Index, Index) [Scalar = float, Index = long, StorageOrder = 0, AlignmentType = 0, Incr = 1]"
                 );
  }
  lVar9 = blocking->m_mc;
  lVar7 = blocking->m_nc;
  local_c0 = rows;
  if (lVar9 < rows) {
    local_c0 = lVar9;
  }
  local_60 = cols;
  if (lVar7 < cols) {
    local_60 = lVar7;
  }
  local_58 = blocking->m_kc;
  uVar5 = local_c0 * blocking->m_kc;
  if (uVar5 >> 0x3e != 0) {
LAB_0016c36f:
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = boost::program_options::detail::cmdline::cmdline;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_70 = blocking->m_blockA;
  local_68 = cols;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (uVar5 < 0x8001) {
      pLVar3 = (LhsScalar *)((long)&local_128 - (uVar5 * 4 + 0x1e & 0xfffffffffffffff0));
      local_70 = pLVar3;
      pLVar6 = pLVar3;
    }
    else {
      local_90 = rows;
      pLVar3 = (LhsScalar *)malloc(uVar5 * 4);
      if (((ulong)pLVar3 & 0xf) != 0) goto LAB_0016c3d5;
      local_70 = pLVar3;
      pLVar6 = (LhsScalar *)&local_128;
      rows = local_90;
      if (pLVar3 == (LhsScalar *)0x0) goto LAB_0016c36f;
    }
  }
  else {
    pLVar3 = (LhsScalar *)0x0;
    pLVar6 = (LhsScalar *)&local_128;
  }
  uVar8 = local_60 * local_58;
  if (0x3fffffffffffffff < uVar8) {
    pLVar6[-2] = 2.090576e-39;
    pLVar6[-1] = 0.0;
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = boost::program_options::detail::cmdline::cmdline;
    pLVar6[-2] = 2.090627e-39;
    pLVar6[-1] = 0.0;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_78 = blocking->m_blockB;
  local_50 = uVar5;
  local_48 = pLVar3;
  local_b8 = uVar8;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (uVar8 < 0x8001) {
      pLVar6 = (LhsScalar *)((long)pLVar6 - (uVar8 * 4 + 0x1e & 0xfffffffffffffff0));
      local_40 = pLVar6;
      local_78 = pLVar6;
    }
    else {
      pLVar6[-2] = 2.089344e-39;
      pLVar6[-1] = 0.0;
      local_40 = (RhsScalar *)malloc(uVar8 * 4);
      if (((ulong)local_40 & 0xf) != 0) {
LAB_0016c3d5:
        *(undefined8 *)((long)pLVar6 + -8) = 0x16c3f4;
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/Memory.h"
                      ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      local_78 = local_40;
      if (local_40 == (RhsScalar *)0x0) {
        pLVar6[-2] = 2.09069e-39;
        pLVar6[-1] = 0.0;
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = boost::program_options::detail::cmdline::cmdline;
        *(undefined1 **)(pLVar6 + -2) = &LAB_0016c422;
        __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_40 = (RhsScalar *)0x0;
  }
  if (0 < rows) {
    local_c8 = _res;
    local_31 = (local_58 != depth || rows <= lVar9) || lVar7 < local_68;
    local_100 = local_58 * 4;
    local_128 = rhsStride * local_60 * 4;
    local_f0 = local_c0 * 4;
    local_120 = resStride * local_60 * 4;
    local_108 = depth;
    local_90 = rows;
    lVar9 = 0;
    do {
      local_f8 = local_c0 + lVar9;
      local_a0 = local_90;
      if (local_f8 < local_90) {
        local_a0 = local_f8;
      }
      if (0 < depth) {
        local_a0 = local_a0 - lVar9;
        local_110 = local_e0 + lVar9 * local_d0;
        local_32 = lVar9 == 0 | local_31;
        local_98 = local_e8;
        lVar9 = 0;
        do {
          pLVar3 = local_70;
          lVar11 = local_a0;
          lVar7 = lVar9 + local_58;
          if (lVar7 < depth) {
            depth = lVar7;
          }
          local_88.m_data = local_110 + lVar9;
          local_88.m_stride = local_d0;
          local_d8 = depth - lVar9;
          pLVar6[-4] = 0.0;
          pLVar6[-3] = 0.0;
          pLVar6[-6] = 2.089864e-39;
          pLVar6[-5] = 0.0;
          gemm_pack_lhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_8,_4,___attribute__((__vector_size__(4_*_sizeof(float))))_float,_1,_false,_false>
          ::operator()(&local_35,pLVar3,(const_blas_data_mapper<float,_long,_1> *)&local_88,
                       depth - lVar9,lVar11,0,*(long *)(pLVar6 + -4));
          local_118 = lVar7;
          if (0 < local_68) {
            local_a8 = local_98;
            lVar7 = 0;
            lVar11 = 0;
            lVar9 = local_60;
            pfVar10 = local_c8;
            do {
              pRVar2 = local_78;
              lVar1 = local_d8;
              lVar12 = lVar9;
              if (local_68 < lVar9) {
                lVar12 = local_68;
              }
              if (local_32 != 0) {
                local_88.m_data = local_a8;
                local_88.m_stride = rhsStride;
                pLVar6[-4] = 0.0;
                pLVar6[-3] = 0.0;
                pLVar6[-6] = 2.090044e-39;
                pLVar6[-5] = 0.0;
                gemm_pack_rhs<float,_long,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_4,_0,_false,_false>
                ::operator()(&local_34,pRVar2,(const_blas_data_mapper<float,_long,_0> *)&local_88,
                             lVar1,lVar12 + lVar7,0,*(long *)(pLVar6 + -4));
              }
              local_88.m_data = pfVar10;
              local_88.m_stride = resStride;
              pLVar6[-6] = 0.0;
              pLVar6[-5] = 0.0;
              pLVar6[-4] = 0.0;
              pLVar6[-3] = 0.0;
              pLVar6[-8] = -NAN;
              pLVar6[-7] = -NAN;
              pLVar6[-10] = -NAN;
              pLVar6[-9] = -NAN;
              *(long *)(pLVar6 + -0xc) = lVar12 + lVar7;
              pLVar3 = local_70;
              pRVar2 = local_78;
              lVar12 = local_a0;
              alpha_00 = local_ac;
              lVar1 = local_d8;
              pLVar6[-0xe] = 2.090173e-39;
              pLVar6[-0xd] = 0.0;
              gebp_kernel<float,_float,_long,_Eigen::internal::blas_data_mapper<float,_long,_0,_0,_1>,_8,_4,_false,_false>
              ::operator()(&local_33,&local_88,pLVar3,pRVar2,lVar12,lVar1,*(long *)(pLVar6 + -0xc),
                           alpha_00,*(long *)(pLVar6 + -10),*(long *)(pLVar6 + -8),
                           *(long *)(pLVar6 + -6),*(long *)(pLVar6 + -4));
              lVar11 = lVar11 + local_60;
              lVar9 = lVar9 + local_60;
              lVar7 = lVar7 - local_60;
              local_a8 = (float *)((long)local_a8 + local_128);
              pfVar10 = (float *)((long)pfVar10 + local_120);
            } while (lVar11 < local_68);
          }
          local_98 = (float *)((long)local_98 + local_100);
          lVar9 = local_118;
          depth = local_108;
        } while (local_118 < local_108);
      }
      local_c8 = (float *)((long)local_c8 + local_f0);
      lVar9 = local_f8;
    } while (local_f8 < local_90);
  }
  pRVar2 = local_40;
  if (0x8000 < local_b8) {
    pLVar6[-2] = 2.090398e-39;
    pLVar6[-1] = 0.0;
    free(pRVar2);
  }
  pLVar3 = local_48;
  if (0x8000 < local_50) {
    pLVar6[-2] = 2.090425e-39;
    pLVar6[-1] = 0.0;
    free(pLVar3);
  }
  return;
}

Assistant:

static void run(Index rows, Index cols, Index depth,
  const LhsScalar* _lhs, Index lhsStride,
  const RhsScalar* _rhs, Index rhsStride,
  ResScalar* _res, Index resIncr, Index resStride,
  ResScalar alpha,
  level3_blocking<LhsScalar,RhsScalar>& blocking,
  GemmParallelInfo<Index>* info = 0)
{
  typedef const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> LhsMapper;
  typedef const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> RhsMapper;
  typedef blas_data_mapper<typename Traits::ResScalar, Index, ColMajor,Unaligned,ResInnerStride> ResMapper;
  LhsMapper lhs(_lhs, lhsStride);
  RhsMapper rhs(_rhs, rhsStride);
  ResMapper res(_res, resStride, resIncr);

  Index kc = blocking.kc();                   // cache block size along the K direction
  Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction
  Index nc = (std::min)(cols,blocking.nc());  // cache block size along the N direction

  gemm_pack_lhs<LhsScalar, Index, LhsMapper, Traits::mr, Traits::LhsProgress, typename Traits::LhsPacket4Packing, LhsStorageOrder> pack_lhs;
  gemm_pack_rhs<RhsScalar, Index, RhsMapper, Traits::nr, RhsStorageOrder> pack_rhs;
  gebp_kernel<LhsScalar, RhsScalar, Index, ResMapper, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;

#ifdef EIGEN_HAS_OPENMP
  if(info)
  {
    // this is the parallel version!
    int tid = omp_get_thread_num();
    int threads = omp_get_num_threads();

    LhsScalar* blockA = blocking.blockA();
    eigen_internal_assert(blockA!=0);

    std::size_t sizeB = kc*nc;
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, 0);

    // For each horizontal panel of the rhs, and corresponding vertical panel of the lhs...
    for(Index k=0; k<depth; k+=kc)
    {
      const Index actual_kc = (std::min)(k+kc,depth)-k; // => rows of B', and cols of the A'

      // In order to reduce the chance that a thread has to wait for the other,
      // let's start by packing B'.
      pack_rhs(blockB, rhs.getSubMapper(k,0), actual_kc, nc);

      // Pack A_k to A' in a parallel fashion:
      // each thread packs the sub block A_k,i to A'_i where i is the thread id.

      // However, before copying to A'_i, we have to make sure that no other thread is still using it,
      // i.e., we test that info[tid].users equals 0.
      // Then, we set info[tid].users to the number of threads to mark that all other threads are going to use it.
      while(info[tid].users!=0) {}
      info[tid].users = threads;

      pack_lhs(blockA+info[tid].lhs_start*actual_kc, lhs.getSubMapper(info[tid].lhs_start,k), actual_kc, info[tid].lhs_length);

      // Notify the other threads that the part A'_i is ready to go.
      info[tid].sync = k;

      // Computes C_i += A' * B' per A'_i
      for(int shift=0; shift<threads; ++shift)
      {
        int i = (tid+shift)%threads;

        // At this point we have to make sure that A'_i has been updated by the thread i,
        // we use testAndSetOrdered to mimic a volatile access.
        // However, no need to wait for the B' part which has been updated by the current thread!
        if (shift>0) {
          while(info[i].sync!=k) {
          }
        }

        gebp(res.getSubMapper(info[i].lhs_start, 0), blockA+info[i].lhs_start*actual_kc, blockB, info[i].lhs_length, actual_kc, nc, alpha);
      }

      // Then keep going as usual with the remaining B'
      for(Index j=nc; j<cols; j+=nc)
      {
        const Index actual_nc = (std::min)(j+nc,cols)-j;

        // pack B_k,j to B'
        pack_rhs(blockB, rhs.getSubMapper(k,j), actual_kc, actual_nc);

        // C_j += A' * B'
        gebp(res.getSubMapper(0, j), blockA, blockB, rows, actual_kc, actual_nc, alpha);
      }

      // Release all the sub blocks A'_i of A' for the current thread,
      // i.e., we simply decrement the number of users by 1
      for(Index i=0; i<threads; ++i)
#if !EIGEN_HAS_CXX11_ATOMIC
        #pragma omp atomic
#endif
        info[i].users -= 1;
    }
  }
  else
#endif // EIGEN_HAS_OPENMP
  {
    EIGEN_UNUSED_VARIABLE(info);

    // this is the sequential version!
    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*nc;

    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, blocking.blockB());

    const bool pack_rhs_once = mc!=rows && kc==depth && nc==cols;

    // For each horizontal panel of the rhs, and corresponding panel of the lhs...
    for(Index i2=0; i2<rows; i2+=mc)
    {
      const Index actual_mc = (std::min)(i2+mc,rows)-i2;

      for(Index k2=0; k2<depth; k2+=kc)
      {
        const Index actual_kc = (std::min)(k2+kc,depth)-k2;

        // OK, here we have selected one horizontal panel of rhs and one vertical panel of lhs.
        // => Pack lhs's panel into a sequential chunk of memory (L2/L3 caching)
        // Note that this panel will be read as many times as the number of blocks in the rhs's
        // horizontal panel which is, in practice, a very low number.
        pack_lhs(blockA, lhs.getSubMapper(i2,k2), actual_kc, actual_mc);

        // For each kc x nc block of the rhs's horizontal panel...
        for(Index j2=0; j2<cols; j2+=nc)
        {
          const Index actual_nc = (std::min)(j2+nc,cols)-j2;

          // We pack the rhs's block into a sequential chunk of memory (L2 caching)
          // Note that this block will be read a very high number of times, which is equal to the number of
          // micro horizontal panel of the large rhs's panel (e.g., rows/12 times).
          if((!pack_rhs_once) || i2==0)
            pack_rhs(blockB, rhs.getSubMapper(k2,j2), actual_kc, actual_nc);

          // Everything is packed, we can now call the panel * block kernel:
          gebp(res.getSubMapper(i2, j2), blockA, blockB, actual_mc, actual_kc, actual_nc, alpha);
        }
      }
    }
  }
}